

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlcdnumber.cpp
# Opt level: O0

void __thiscall QLCDNumber::setDigitCount(QLCDNumber *this,int numDigits)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  QLCDNumberPrivate *pQVar4;
  char *pcVar5;
  QChar *pQVar6;
  QBitArray *this_00;
  int in_ESI;
  QString *in_RDI;
  long in_FS_OFFSET;
  int dif;
  int i;
  bool doDisplay;
  QLCDNumberPrivate *d;
  QBitArray tmpPoints;
  QString buf;
  QWidget *in_stack_fffffffffffffea8;
  QLCDNumber *in_stack_fffffffffffffeb0;
  QBitArray *in_stack_fffffffffffffeb8;
  QMessageLogger *in_stack_fffffffffffffec0;
  QString *in_stack_fffffffffffffec8;
  QString *pQVar7;
  int local_120;
  int local_10c;
  QChar local_ca;
  undefined1 *local_c8;
  undefined1 *local_c0;
  undefined1 *local_b8;
  QChar local_ac;
  QChar local_aa [25];
  char local_78 [80];
  char local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar4 = d_func((QLCDNumber *)0x5b97d4);
  local_10c = in_ESI;
  if (99 < in_ESI) {
    QMessageLogger::QMessageLogger
              (in_stack_fffffffffffffec0,(char *)in_stack_fffffffffffffeb8,
               (int)((ulong)in_stack_fffffffffffffeb0 >> 0x20),(char *)in_stack_fffffffffffffea8);
    QObject::objectName();
    QString::toLocal8Bit(in_stack_fffffffffffffec8);
    pcVar5 = QByteArray::constData((QByteArray *)0x5b9838);
    QMessageLogger::warning(local_28,"QLCDNumber::setNumDigits: (%s) Max 99 digits allowed",pcVar5);
    QByteArray::~QByteArray((QByteArray *)0x5b985e);
    QString::~QString((QString *)0x5b986b);
    local_10c = 99;
  }
  if (local_10c < 0) {
    QMessageLogger::QMessageLogger
              (in_stack_fffffffffffffec0,(char *)in_stack_fffffffffffffeb8,
               (int)((ulong)in_stack_fffffffffffffeb0 >> 0x20),(char *)in_stack_fffffffffffffea8);
    QObject::objectName();
    QString::toLocal8Bit(in_stack_fffffffffffffec8);
    pcVar5 = QByteArray::constData((QByteArray *)0x5b98d2);
    QMessageLogger::warning(local_78,"QLCDNumber::setNumDigits: (%s) Min 0 digits allowed",pcVar5);
    QByteArray::~QByteArray((QByteArray *)0x5b98f8);
    QString::~QString((QString *)0x5b9905);
    local_10c = 0;
  }
  bVar2 = QString::isNull((QString *)0x5b991e);
  if (bVar2) {
    pQVar4->ndigits = local_10c;
    pQVar7 = &pQVar4->digitStr;
    QChar::QChar<char16_t,_true>(local_aa,L' ');
    QString::fill((QChar *)pQVar7,(ulong)(ushort)local_aa[0].ucs);
    QBitArray::fill((QBitArray *)in_RDI,SUB81((ulong)pQVar7 >> 0x38,0),
                    (qsizetype)in_stack_fffffffffffffec0);
    QChar::QChar<char16_t,_true>(&local_ac,L'0');
    pQVar6 = QString::operator[]((QString *)in_stack_fffffffffffffea8,0x5b99c9);
    pQVar6->ucs = local_ac.ucs;
  }
  else {
    iVar1 = pQVar4->ndigits;
    if (local_10c != pQVar4->ndigits) {
      if (pQVar4->ndigits < local_10c) {
        iVar3 = local_10c - pQVar4->ndigits;
        local_c8 = &DAT_aaaaaaaaaaaaaaaa;
        local_c0 = &DAT_aaaaaaaaaaaaaaaa;
        local_b8 = &DAT_aaaaaaaaaaaaaaaa;
        QString::QString((QString *)0x5b9a76);
        QChar::QChar<char16_t,_true>(&local_ca,L' ');
        QString::fill((QChar *)&local_c8,(ulong)(ushort)local_ca.ucs);
        QString::insert(in_RDI,(qsizetype)in_stack_fffffffffffffec8,
                        (QString *)in_stack_fffffffffffffec0);
        QBitArray::resize((longlong)&pQVar4->points);
        local_120 = local_10c;
        while (local_120 = local_120 + -1, iVar3 <= local_120) {
          in_stack_fffffffffffffeb8 = &pQVar4->points;
          this_00 = (QBitArray *)(long)local_120;
          QBitArray::testBit((QBitArray *)in_stack_fffffffffffffeb0,
                             (qsizetype)in_stack_fffffffffffffea8);
          QBitArray::setBit(this_00,(qsizetype)in_stack_fffffffffffffeb8,
                            SUB81((ulong)in_stack_fffffffffffffeb0 >> 0x38,0));
        }
        for (local_120 = 0; local_120 < iVar3; local_120 = local_120 + 1) {
          QBitArray::clearBit((QBitArray *)in_stack_fffffffffffffea8,0x5b9b6a);
        }
        QString::~QString((QString *)0x5b9b84);
      }
      else {
        QString::right(in_stack_fffffffffffffec8,(qsizetype)in_stack_fffffffffffffec0);
        QString::operator=((QString *)in_stack_fffffffffffffeb0,(QString *)in_stack_fffffffffffffea8
                          );
        QString::~QString((QString *)0x5b9bd7);
        QBitArray::QBitArray
                  ((QBitArray *)in_stack_fffffffffffffeb0,(QBitArray *)in_stack_fffffffffffffea8);
        QBitArray::resize((longlong)&pQVar4->points);
        for (local_120 = 0; local_120 < local_10c; local_120 = local_120 + 1) {
          in_stack_fffffffffffffea8 = (QWidget *)&pQVar4->points;
          in_stack_fffffffffffffeb0 = (QLCDNumber *)(long)local_120;
          QBitArray::testBit((QBitArray *)in_stack_fffffffffffffeb0,
                             (qsizetype)in_stack_fffffffffffffea8);
          QBitArray::setBit((QBitArray *)in_stack_fffffffffffffec0,
                            (qsizetype)in_stack_fffffffffffffeb8,
                            SUB81((ulong)in_stack_fffffffffffffeb0 >> 0x38,0));
        }
        QBitArray::~QBitArray((QBitArray *)0x5b9c92);
      }
      pQVar4->ndigits = local_10c;
      if (iVar1 == 0) {
        value(in_stack_fffffffffffffeb0);
        display((QLCDNumber *)in_stack_fffffffffffffeb8,(double)in_stack_fffffffffffffeb0);
      }
      QWidget::update(in_stack_fffffffffffffea8);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QLCDNumber::setDigitCount(int numDigits)
{
    Q_D(QLCDNumber);
    if (Q_UNLIKELY(numDigits > 99)) {
        qWarning("QLCDNumber::setNumDigits: (%s) Max 99 digits allowed",
                 objectName().toLocal8Bit().constData());
        numDigits = 99;
    }
    if (Q_UNLIKELY(numDigits < 0)) {
        qWarning("QLCDNumber::setNumDigits: (%s) Min 0 digits allowed",
                 objectName().toLocal8Bit().constData());
        numDigits = 0;
    }
    if (d->digitStr.isNull()) {                  // from constructor
        d->ndigits = numDigits;
        d->digitStr.fill(u' ', d->ndigits);
        d->points.fill(0, d->ndigits);
        d->digitStr[d->ndigits - 1] = u'0'; // "0" is the default number
    } else {
        bool doDisplay = d->ndigits == 0;
        if (numDigits == d->ndigits)             // no change
            return;
        int i;
        int dif;
        if (numDigits > d->ndigits) {            // expand
            dif = numDigits - d->ndigits;
            QString buf;
            buf.fill(u' ', dif);
            d->digitStr.insert(0, buf);
            d->points.resize(numDigits);
            for (i=numDigits-1; i>=dif; i--)
                d->points.setBit(i, d->points.testBit(i-dif));
            for (i=0; i<dif; i++)
                d->points.clearBit(i);
        } else {                                        // shrink
            dif = d->ndigits - numDigits;
            d->digitStr = d->digitStr.right(numDigits);
            QBitArray tmpPoints = d->points;
            d->points.resize(numDigits);
            for (i=0; i<numDigits; i++)
                d->points.setBit(i, tmpPoints.testBit(i+dif));
        }
        d->ndigits = numDigits;
        if (doDisplay)
            display(value());
        update();
    }
}